

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O0

void __thiscall Js::EngineInterfaceObject::Initialize(EngineInterfaceObject *this)

{
  Recycler *recycler_00;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  RecyclableObject *prototype;
  DeferredTypeHandler<&Js::EngineInterfaceObject::InitializeCommonNativeInterfaces,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler;
  DynamicType *type;
  DynamicObject *ptr;
  DynamicObject **ppDVar1;
  EngineExtensionObjectBase **ppEVar2;
  EngineExtensionObjectBase *pEVar3;
  uint local_2c;
  uint i;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  Recycler *recycler;
  EngineInterfaceObject *this_local;
  
  recycler_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetLibrary(this_00);
  prototype = JavascriptLibraryBase::GetNull(&this_01->super_JavascriptLibraryBase);
  typeHandler = DeferredTypeHandler<&Js::EngineInterfaceObject::InitializeCommonNativeInterfaces,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
                ::GetDefaultInstance();
  type = DynamicType::New(this_00,TypeIds_Object,prototype,(JavascriptMethod)0x0,
                          (DynamicTypeHandler *)typeHandler,false,false);
  ptr = DynamicObject::New(recycler_00,type);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=(&this->commonNativeInterfaces,ptr);
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&this->commonNativeInterfaces);
  JavascriptLibrary::AddMember(this_01,&this->super_DynamicObject,0x207,*ppDVar1);
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    ppEVar2 = Memory::WriteBarrierPtr::operator_cast_to_EngineExtensionObjectBase__
                        ((WriteBarrierPtr *)(this->engineExtensions + local_2c));
    if (*ppEVar2 != (EngineExtensionObjectBase *)0x0) {
      pEVar3 = Memory::WriteBarrierPtr<Js::EngineExtensionObjectBase>::operator->
                         (this->engineExtensions + local_2c);
      (**pEVar3->_vptr_EngineExtensionObjectBase)();
    }
  }
  return;
}

Assistant:

void EngineInterfaceObject::Initialize()
    {
        Recycler* recycler = this->GetRecycler();
        ScriptContext* scriptContext = this->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        // CommonNativeInterfaces is used as a prototype for the other native interface objects
        // to share the common APIs without requiring everyone to access EngineInterfaceObject.Common.
        this->commonNativeInterfaces = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, library->GetNull(), nullptr,
            DeferredTypeHandler<InitializeCommonNativeInterfaces>::GetDefaultInstance()));
        library->AddMember(this, Js::PropertyIds::Common, this->commonNativeInterfaces);

        for (uint i = 0; i <= MaxEngineInterfaceExtensionKind; i++)
        {
            if (engineExtensions[i] != nullptr)
            {
                engineExtensions[i]->Initialize();
            }
        }
    }